

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS ref_geom_face_tec_zone(REF_GRID ref_grid,REF_INT id,FILE *file)

{
  uint uVar1;
  REF_STATUS RVar2;
  REF_INT local_388;
  REF_DBL local_380;
  REF_DBL local_378;
  REF_DBL local_370;
  double local_368;
  double local_358;
  REF_DBL local_350;
  REF_DBL local_348;
  REF_DBL local_340;
  double local_338;
  double local_328;
  int local_31c;
  int local_318;
  int local_314;
  REF_INT local_310;
  REF_INT local_308;
  REF_INT local_304;
  REF_DBL local_300;
  REF_DBL local_2f8;
  REF_DBL local_2f0;
  double local_2e8;
  double local_2d8;
  REF_DBL local_2d0;
  REF_DBL local_2c8;
  REF_DBL local_2c0;
  double local_2b8;
  double local_2a8;
  REF_INT local_2a0;
  REF_INT local_29c;
  REF_INT local_298;
  REF_INT local_294;
  REF_DBL local_290;
  REF_DBL local_288;
  REF_DBL local_280;
  double local_278;
  double local_268;
  REF_DBL local_260;
  REF_DBL local_258;
  REF_DBL local_250;
  double local_248;
  double local_238;
  REF_INT local_22c;
  REF_INT local_228;
  REF_INT local_224;
  REF_INT local_220;
  int local_21c;
  REF_STATUS ref_private_macro_code_rss_29;
  REF_STATUS ref_private_macro_code_rss_28;
  REF_STATUS ref_private_macro_code_rss_27;
  REF_STATUS ref_private_macro_code_rss_26;
  REF_STATUS ref_private_macro_code_rss_25;
  REF_STATUS ref_private_macro_code_rss_24;
  REF_STATUS ref_private_macro_code_rss_23;
  REF_STATUS ref_private_macro_code_rss_22;
  REF_STATUS ref_private_macro_code_rss_21;
  REF_STATUS ref_private_macro_code_rss_20;
  REF_STATUS ref_private_macro_code_rxs_2;
  REF_STATUS ref_private_macro_code_rss_19;
  REF_STATUS ref_private_macro_code_rss_18;
  REF_STATUS ref_private_macro_code_rxs_1;
  REF_STATUS ref_private_macro_code_rss_17;
  REF_STATUS ref_private_macro_code_rss_16;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_STATUS ref_private_macro_code_rxs;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_INT ref_malloc_init_i;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL gap;
  REF_DBL kmax;
  REF_DBL kmin;
  REF_DBL xyz [3];
  REF_DBL local_158;
  REF_DBL s [3];
  REF_DBL ks;
  REF_DBL r [3];
  REF_DBL kr;
  REF_DBL param [2];
  REF_DBL *uv;
  uint local_f8;
  REF_INT sens;
  REF_INT ntri;
  REF_INT nnode_degen;
  REF_INT nnode_sens0;
  REF_INT nnode;
  REF_INT node;
  REF_INT local;
  REF_INT item;
  REF_INT item2;
  REF_INT nodes [27];
  int local_60;
  REF_INT local_5c;
  REF_INT cell;
  REF_INT geom;
  REF_DICT ref_dict_degen;
  REF_DICT ref_dict_jump;
  REF_DICT ref_dict;
  REF_GEOM ref_geom;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  FILE *file_local;
  REF_GRID pRStack_18;
  REF_INT id_local;
  REF_GRID ref_grid_local;
  
  ref_cell = (REF_CELL)ref_grid->node;
  ref_geom = (REF_GEOM)ref_grid->cell[3];
  ref_dict = (REF_DICT)ref_grid->geom;
  ref_node = (REF_NODE)file;
  file_local._4_4_ = id;
  pRStack_18 = ref_grid;
  uVar1 = ref_dict_create(&ref_dict_jump);
  if (uVar1 == 0) {
    uVar1 = ref_dict_create(&ref_dict_degen);
    if (uVar1 == 0) {
      uVar1 = ref_dict_create((REF_DICT *)&cell);
      if (uVar1 == 0) {
        for (local_5c = 0; local_5c < ref_dict->max; local_5c = local_5c + 1) {
          if ((ref_dict->key[local_5c * 6] == 2) &&
             (nnode_sens0 = ref_dict->key[local_5c * 6 + 5],
             file_local._4_4_ == ref_dict->key[local_5c * 6 + 1])) {
            if (ref_dict->key[local_5c * 6 + 4] == 0) {
              uVar1 = ref_dict_store(ref_dict_jump,nnode_sens0,local_5c);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0xcb1,"ref_geom_face_tec_zone",(ulong)uVar1,"mark nodes");
                return uVar1;
              }
              if ((ref_dict->key[local_5c * 6 + 3] != 0) &&
                 (uVar1 = ref_dict_store(ref_dict_degen,nnode_sens0,local_5c), uVar1 != 0)) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0xcb3,"ref_geom_face_tec_zone",(ulong)uVar1,"mark jump");
                return uVar1;
              }
            }
            else {
              if ((nnode_sens0 < 0) ||
                 (*(int *)ref_geom->segments_per_radian_of_curvature <= nnode_sens0)) {
                local_21c = -1;
              }
              else {
                local_21c = *(int *)(*(long *)((long)ref_geom->segments_per_radian_of_curvature + 8)
                                    + (long)nnode_sens0 * 4);
              }
              node = local_21c;
              if (local_21c == -1) {
                local_220 = -1;
              }
              else {
                local_220 = *(REF_INT *)
                             (*(long *)((long)ref_geom->segments_per_radian_of_curvature + 0x10) + 4
                             + (long)local_21c * 8);
              }
              local_60 = local_220;
              while (node != -1) {
                uVar1 = ref_cell_nodes((REF_CELL)ref_geom,local_60,&item);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                         ,0xcb7,"ref_geom_face_tec_zone",(ulong)uVar1,"nodes");
                  return uVar1;
                }
                if ((file_local._4_4_ == nodes[1]) &&
                   (uVar1 = ref_dict_store(_cell,local_60,nnode_sens0), uVar1 != 0)) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                         ,0xcb9,"ref_geom_face_tec_zone",(ulong)uVar1,"mark degen");
                  return uVar1;
                }
                node = *(int *)(*(long *)((long)ref_geom->segments_per_radian_of_curvature + 0x10) +
                               (long)node * 8);
                if (node == -1) {
                  local_224 = -1;
                }
                else {
                  local_224 = *(REF_INT *)
                               (*(long *)((long)ref_geom->segments_per_radian_of_curvature + 0x10) +
                                4 + (long)node * 8);
                }
                local_60 = local_224;
              }
            }
          }
        }
        ntri = ref_dict_jump->n;
        sens = ref_dict_jump->n + ref_dict_degen->n;
        nnode_degen = ref_dict_jump->n + ref_dict_degen->n + _cell->n;
        local_f8 = 0;
        for (local_60 = 0; local_60 < *(int *)((long)&ref_geom->initial_cell_height + 4);
            local_60 = local_60 + 1) {
          RVar2 = ref_cell_nodes((REF_CELL)ref_geom,local_60,&item);
          if ((RVar2 == 0) && (file_local._4_4_ == nodes[1])) {
            local_f8 = local_f8 + 1;
          }
        }
        if ((nnode_degen == 0) || (local_f8 == 0)) {
          uVar1 = ref_dict_free(_cell);
          if (uVar1 == 0) {
            uVar1 = ref_dict_free(ref_dict_degen);
            if (uVar1 == 0) {
              ref_grid_local._4_4_ = ref_dict_free(ref_dict_jump);
              if (ref_grid_local._4_4_ == 0) {
                ref_grid_local._4_4_ = 0;
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0xcd0,"ref_geom_face_tec_zone",(ulong)ref_grid_local._4_4_,"free dict");
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0xccf,"ref_geom_face_tec_zone",(ulong)uVar1,"free jump");
              ref_grid_local._4_4_ = uVar1;
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0xcce,"ref_geom_face_tec_zone",(ulong)uVar1,"free degen");
            ref_grid_local._4_4_ = uVar1;
          }
        }
        else {
          fprintf((FILE *)ref_node,
                  "zone t=\"face%d\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
                  (ulong)file_local._4_4_,(ulong)(uint)nnode_degen,(ulong)local_f8,"point",
                  "fetriangle");
          if (nnode_degen * 2 < 0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0xcd9,"ref_geom_face_tec_zone","malloc uv of REF_DBL negative");
            ref_grid_local._4_4_ = 1;
          }
          else {
            param[1] = (REF_DBL)malloc((long)(nnode_degen << 1) << 3);
            if ((void *)param[1] == (void *)0x0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0xcd9,"ref_geom_face_tec_zone","malloc uv of REF_DBL NULL");
              ref_grid_local._4_4_ = 2;
            }
            else {
              for (ref_private_macro_code_rss_11 = 0;
                  SBORROW4(ref_private_macro_code_rss_11,nnode_degen * 2) !=
                  ref_private_macro_code_rss_11 + nnode_degen * -2 < 0;
                  ref_private_macro_code_rss_11 = ref_private_macro_code_rss_11 + 1) {
                *(undefined8 *)((long)param[1] + (long)ref_private_macro_code_rss_11 * 8) =
                     0xbff0000000000000;
              }
              for (local_60 = 0; local_60 < *(int *)((long)&ref_geom->initial_cell_height + 4);
                  local_60 = local_60 + 1) {
                RVar2 = ref_cell_nodes((REF_CELL)ref_geom,local_60,&item);
                if ((RVar2 == 0) && (file_local._4_4_ == nodes[1])) {
                  for (nnode_sens0 = 0; nnode_sens0 < *(int *)&ref_geom->field_0xc;
                      nnode_sens0 = nnode_sens0 + 1) {
                    uVar1 = ref_geom_find((REF_GEOM)ref_dict,(&item)[nnode_sens0],2,file_local._4_4_
                                          ,&local_5c);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                             ,0xcde,"ref_geom_face_tec_zone",(ulong)uVar1,"find");
                      return uVar1;
                    }
                    uVar1 = ref_geom_cell_tuv((REF_GEOM)ref_dict,(&item)[nnode_sens0],&item,2,&kr,
                                              (REF_INT *)((long)&uv + 4));
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                             ,0xce1,"ref_geom_face_tec_zone",(ulong)uVar1,"cell tuv");
                      return uVar1;
                    }
                    if (ref_dict->key[local_5c * 6 + 4] == 0) {
                      if ((uv._4_4_ == 0) || (uv._4_4_ == 1)) {
                        uVar1 = ref_dict_location(ref_dict_jump,(&item)[nnode_sens0],&nnode);
                        if (uVar1 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                 ,0xce4,"ref_geom_face_tec_zone",(ulong)uVar1,"localize");
                          return uVar1;
                        }
                      }
                      else {
                        uVar1 = ref_dict_location(ref_dict_degen,(&item)[nnode_sens0],&nnode);
                        if (uVar1 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                 ,0xce7,"ref_geom_face_tec_zone",(ulong)uVar1,"localize");
                          return uVar1;
                        }
                        nnode = ntri + nnode;
                      }
                    }
                    else {
                      uVar1 = ref_dict_location(_cell,local_60,&nnode);
                      if (uVar1 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                               ,0xceb,"ref_geom_face_tec_zone",(ulong)uVar1,"localize");
                        return uVar1;
                      }
                      nnode = sens + nnode;
                    }
                    *(REF_DBL *)((long)param[1] + (long)(nnode << 1) * 8) = kr;
                    *(REF_DBL *)((long)param[1] + (long)(nnode * 2 + 1) * 8) = param[0];
                  }
                }
              }
              node = 0;
              if (ref_dict_jump->n < 1) {
                local_228 = -1;
              }
              else {
                local_228 = *ref_dict_jump->key;
              }
              nnode_sens0 = local_228;
              if (ref_dict_jump->n < 1) {
                local_22c = -1;
              }
              else {
                local_22c = *ref_dict_jump->value;
              }
              local_5c = local_22c;
              while (node < ref_dict_jump->n) {
                r[2] = 0.0;
                s[2] = 0.0;
                _ref_private_macro_code_rss_1 = 0.0;
                kmin = *(REF_DBL *)(ref_cell->c2n + (long)(nnode_sens0 * 0xf) * 2);
                xyz[0] = *(REF_DBL *)(ref_cell->c2n + (long)(nnode_sens0 * 0xf + 1) * 2);
                xyz[1] = *(REF_DBL *)(ref_cell->c2n + (long)(nnode_sens0 * 0xf + 2) * 2);
                if (ref_dict[4].key != (REF_INT *)0x0) {
                  uVar1 = ref_egads_face_curvature
                                    ((REF_GEOM)ref_dict,local_5c,r + 2,&ks,s + 2,&local_158);
                  if ((uVar1 != 0) && (uVar1 != 1)) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                           ,0xcfd,"ref_geom_face_tec_zone",(ulong)uVar1,"curve");
                    return uVar1;
                  }
                  uVar1 = ref_egads_eval_at((REF_GEOM)ref_dict,2,file_local._4_4_,
                                            (REF_DBL *)((long)param[1] + (long)(node << 1) * 8),
                                            &kmin,(REF_DBL *)0x0);
                  if (uVar1 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                           ,0xd00,"ref_geom_face_tec_zone",(ulong)uVar1,"eval at");
                    return uVar1;
                  }
                  uVar1 = ref_egads_gap((REF_GEOM)ref_dict,nnode_sens0,
                                        (REF_DBL *)&ref_private_macro_code_rss_1);
                  if (uVar1 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                           ,0xd01,"ref_geom_face_tec_zone",(ulong)uVar1,"gap");
                    return uVar1;
                  }
                }
                if ((ref_dict[6].value != (REF_INT *)0x0) &&
                   (uVar1 = ref_meshlink_face_curvature
                                      (pRStack_18,local_5c,r + 2,&ks,s + 2,&local_158), uVar1 != 0))
                {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                         ,0xd04,"ref_geom_face_tec_zone",(ulong)uVar1,"curve");
                  return uVar1;
                }
                if (r[2] <= 0.0) {
                  local_238 = -r[2];
                }
                else {
                  local_238 = r[2];
                }
                if (s[2] <= 0.0) {
                  local_248 = -s[2];
                }
                else {
                  local_248 = s[2];
                }
                if (local_238 <= local_248) {
                  if (s[2] <= 0.0) {
                    local_260 = -s[2];
                  }
                  else {
                    local_260 = s[2];
                  }
                  local_258 = local_260;
                }
                else {
                  if (r[2] <= 0.0) {
                    local_250 = -r[2];
                  }
                  else {
                    local_250 = r[2];
                  }
                  local_258 = local_250;
                }
                gap = local_258;
                if (r[2] <= 0.0) {
                  local_268 = -r[2];
                }
                else {
                  local_268 = r[2];
                }
                if (s[2] <= 0.0) {
                  local_278 = -s[2];
                }
                else {
                  local_278 = s[2];
                }
                if (local_278 <= local_268) {
                  if (s[2] <= 0.0) {
                    local_290 = -s[2];
                  }
                  else {
                    local_290 = s[2];
                  }
                  local_288 = local_290;
                }
                else {
                  if (r[2] <= 0.0) {
                    local_280 = -r[2];
                  }
                  else {
                    local_280 = r[2];
                  }
                  local_288 = local_280;
                }
                kmax = local_288;
                fprintf((FILE *)ref_node," %.16e %.16e %.16e %.16e %.16e %.16e %.16e %16e\n",kmin,
                        xyz[0],xyz[1],_ref_private_macro_code_rss_1,
                        *(undefined8 *)((long)param[1] + (long)(node << 1) * 8),
                        *(undefined8 *)((long)param[1] + (long)(node * 2 + 1) * 8),local_258,
                        local_288);
                node = node + 1;
                if ((node < 0) || (ref_dict_jump->n <= node)) {
                  local_294 = -1;
                }
                else {
                  local_294 = ref_dict_jump->key[node];
                }
                nnode_sens0 = local_294;
                if ((node < 0) || (ref_dict_jump->n <= node)) {
                  local_298 = -1;
                }
                else {
                  local_298 = ref_dict_jump->value[node];
                }
                local_5c = local_298;
              }
              node = 0;
              if (ref_dict_degen->n < 1) {
                local_29c = -1;
              }
              else {
                local_29c = *ref_dict_degen->key;
              }
              nnode_sens0 = local_29c;
              if (ref_dict_degen->n < 1) {
                local_2a0 = -1;
              }
              else {
                local_2a0 = *ref_dict_degen->value;
              }
              local_5c = local_2a0;
              while (node < ref_dict_degen->n) {
                r[2] = 0.0;
                s[2] = 0.0;
                _ref_private_macro_code_rss_1 = 0.0;
                kmin = *(REF_DBL *)(ref_cell->c2n + (long)(nnode_sens0 * 0xf) * 2);
                xyz[0] = *(REF_DBL *)(ref_cell->c2n + (long)(nnode_sens0 * 0xf + 1) * 2);
                xyz[1] = *(REF_DBL *)(ref_cell->c2n + (long)(nnode_sens0 * 0xf + 2) * 2);
                if (ref_dict[4].key != (REF_INT *)0x0) {
                  uVar1 = ref_egads_face_curvature
                                    ((REF_GEOM)ref_dict,local_5c,r + 2,&ks,s + 2,&local_158);
                  if ((uVar1 != 0) && (uVar1 != 1)) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                           ,0xd15,"ref_geom_face_tec_zone",(ulong)uVar1,"curve");
                    return uVar1;
                  }
                  uVar1 = ref_egads_eval_at((REF_GEOM)ref_dict,2,file_local._4_4_,
                                            (REF_DBL *)
                                            ((long)param[1] + (long)((ntri + node) * 2) * 8),&kmin,
                                            (REF_DBL *)0x0);
                  if (uVar1 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                           ,0xd18,"ref_geom_face_tec_zone",(ulong)uVar1,"eval at");
                    return uVar1;
                  }
                  uVar1 = ref_egads_gap((REF_GEOM)ref_dict,nnode_sens0,
                                        (REF_DBL *)&ref_private_macro_code_rss_1);
                  if (uVar1 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                           ,0xd19,"ref_geom_face_tec_zone",(ulong)uVar1,"gap");
                    return uVar1;
                  }
                }
                if (r[2] <= 0.0) {
                  local_2a8 = -r[2];
                }
                else {
                  local_2a8 = r[2];
                }
                if (s[2] <= 0.0) {
                  local_2b8 = -s[2];
                }
                else {
                  local_2b8 = s[2];
                }
                if (local_2a8 <= local_2b8) {
                  if (s[2] <= 0.0) {
                    local_2d0 = -s[2];
                  }
                  else {
                    local_2d0 = s[2];
                  }
                  local_2c8 = local_2d0;
                }
                else {
                  if (r[2] <= 0.0) {
                    local_2c0 = -r[2];
                  }
                  else {
                    local_2c0 = r[2];
                  }
                  local_2c8 = local_2c0;
                }
                gap = local_2c8;
                if (r[2] <= 0.0) {
                  local_2d8 = -r[2];
                }
                else {
                  local_2d8 = r[2];
                }
                if (s[2] <= 0.0) {
                  local_2e8 = -s[2];
                }
                else {
                  local_2e8 = s[2];
                }
                if (local_2d8 <= local_2e8) {
                  if (s[2] <= 0.0) {
                    local_300 = -s[2];
                  }
                  else {
                    local_300 = s[2];
                  }
                  local_2f8 = local_300;
                }
                else {
                  if (r[2] <= 0.0) {
                    local_2f0 = -r[2];
                  }
                  else {
                    local_2f0 = r[2];
                  }
                  local_2f8 = local_2f0;
                }
                kmax = local_2f8;
                fprintf((FILE *)ref_node," %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e\n",kmin,
                        xyz[0],xyz[1],_ref_private_macro_code_rss_1,
                        *(undefined8 *)((long)param[1] + (long)((ntri + node) * 2) * 8),
                        *(undefined8 *)((long)param[1] + (long)((ntri + node) * 2 + 1) * 8),
                        local_2c8,local_2f8);
                node = node + 1;
                if ((node < 0) || (ref_dict_degen->n <= node)) {
                  local_304 = -1;
                }
                else {
                  local_304 = ref_dict_degen->key[node];
                }
                nnode_sens0 = local_304;
                if ((node < 0) || (ref_dict_degen->n <= node)) {
                  local_308 = -1;
                }
                else {
                  local_308 = ref_dict_degen->value[node];
                }
                local_5c = local_308;
              }
              node = 0;
              if (_cell->n < 1) {
                local_310 = -1;
              }
              else {
                local_310 = *_cell->value;
              }
              nnode_sens0 = local_310;
              while (node < _cell->n) {
                r[2] = 0.0;
                s[2] = 0.0;
                _ref_private_macro_code_rss_1 = 0.0;
                kmin = *(REF_DBL *)(ref_cell->c2n + (long)(nnode_sens0 * 0xf) * 2);
                xyz[0] = *(REF_DBL *)(ref_cell->c2n + (long)(nnode_sens0 * 0xf + 1) * 2);
                xyz[1] = *(REF_DBL *)(ref_cell->c2n + (long)(nnode_sens0 * 0xf + 2) * 2);
                if (ref_dict[4].key != (REF_INT *)0x0) {
                  if ((nnode_sens0 < 0) || (**(int **)(ref_dict + 3) <= nnode_sens0)) {
                    local_314 = -1;
                  }
                  else {
                    local_314 = *(int *)(*(long *)(*(long *)(ref_dict + 3) + 8) +
                                        (long)nnode_sens0 * 4);
                  }
                  local = local_314;
                  if (local_314 == -1) {
                    local_318 = -1;
                  }
                  else {
                    local_318 = *(int *)(*(long *)(*(long *)(ref_dict + 3) + 0x10) + 4 +
                                        (long)local_314 * 8);
                  }
                  local_5c = local_318;
                  while (local != -1) {
                    if ((((ref_dict->key[local_5c * 6] == 2) &&
                         (ref_dict->key[local_5c * 6 + 1] == file_local._4_4_)) &&
                        (uVar1 = ref_egads_face_curvature
                                           ((REF_GEOM)ref_dict,local_5c,r + 2,&ks,s + 2,&local_158),
                        uVar1 != 0)) && (uVar1 != 1)) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                             ,0xd2d,"ref_geom_face_tec_zone",(ulong)uVar1,"curve");
                      return uVar1;
                    }
                    local = *(int *)(*(long *)(*(long *)(ref_dict + 3) + 0x10) + (long)local * 8);
                    if (local == -1) {
                      local_31c = -1;
                    }
                    else {
                      local_31c = *(int *)(*(long *)(*(long *)(ref_dict + 3) + 0x10) + 4 +
                                          (long)local * 8);
                    }
                    local_5c = local_31c;
                  }
                  uVar1 = ref_egads_eval_at((REF_GEOM)ref_dict,2,file_local._4_4_,
                                            (REF_DBL *)
                                            ((long)param[1] + (long)((sens + node) * 2) * 8),&kmin,
                                            (REF_DBL *)0x0);
                  if (uVar1 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                           ,0xd32,"ref_geom_face_tec_zone",(ulong)uVar1,"eval at");
                    return uVar1;
                  }
                  uVar1 = ref_egads_gap((REF_GEOM)ref_dict,nnode_sens0,
                                        (REF_DBL *)&ref_private_macro_code_rss_1);
                  if (uVar1 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                           ,0xd33,"ref_geom_face_tec_zone",(ulong)uVar1,"gap");
                    return uVar1;
                  }
                }
                if (r[2] <= 0.0) {
                  local_328 = -r[2];
                }
                else {
                  local_328 = r[2];
                }
                if (s[2] <= 0.0) {
                  local_338 = -s[2];
                }
                else {
                  local_338 = s[2];
                }
                if (local_328 <= local_338) {
                  if (s[2] <= 0.0) {
                    local_350 = -s[2];
                  }
                  else {
                    local_350 = s[2];
                  }
                  local_348 = local_350;
                }
                else {
                  if (r[2] <= 0.0) {
                    local_340 = -r[2];
                  }
                  else {
                    local_340 = r[2];
                  }
                  local_348 = local_340;
                }
                gap = local_348;
                if (r[2] <= 0.0) {
                  local_358 = -r[2];
                }
                else {
                  local_358 = r[2];
                }
                if (s[2] <= 0.0) {
                  local_368 = -s[2];
                }
                else {
                  local_368 = s[2];
                }
                if (local_358 <= local_368) {
                  if (s[2] <= 0.0) {
                    local_380 = -s[2];
                  }
                  else {
                    local_380 = s[2];
                  }
                  local_378 = local_380;
                }
                else {
                  if (r[2] <= 0.0) {
                    local_370 = -r[2];
                  }
                  else {
                    local_370 = r[2];
                  }
                  local_378 = local_370;
                }
                kmax = local_378;
                fprintf((FILE *)ref_node," %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e\n",kmin,
                        xyz[0],xyz[1],_ref_private_macro_code_rss_1,
                        *(undefined8 *)((long)param[1] + (long)((sens + node) * 2) * 8),
                        *(undefined8 *)((long)param[1] + (long)((sens + node) * 2 + 1) * 8),
                        local_348,local_378);
                node = node + 1;
                if ((node < 0) || (_cell->n <= node)) {
                  local_388 = -1;
                }
                else {
                  local_388 = _cell->value[node];
                }
                nnode_sens0 = local_388;
              }
              if (param[1] != 0.0) {
                free((void *)param[1]);
              }
              for (local_60 = 0; local_60 < *(int *)((long)&ref_geom->initial_cell_height + 4);
                  local_60 = local_60 + 1) {
                RVar2 = ref_cell_nodes((REF_CELL)ref_geom,local_60,&item);
                if ((RVar2 == 0) && (file_local._4_4_ == nodes[1])) {
                  for (nnode_sens0 = 0; nnode_sens0 < *(int *)&ref_geom->field_0xc;
                      nnode_sens0 = nnode_sens0 + 1) {
                    uVar1 = ref_geom_find((REF_GEOM)ref_dict,(&item)[nnode_sens0],2,file_local._4_4_
                                          ,&local_5c);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                             ,0xd41,"ref_geom_face_tec_zone",(ulong)uVar1,"find");
                      return uVar1;
                    }
                    uVar1 = ref_geom_cell_tuv((REF_GEOM)ref_dict,(&item)[nnode_sens0],&item,2,&kr,
                                              (REF_INT *)((long)&uv + 4));
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                             ,0xd44,"ref_geom_face_tec_zone",(ulong)uVar1,"cell tuv");
                      return uVar1;
                    }
                    if (ref_dict->key[local_5c * 6 + 4] == 0) {
                      if ((uv._4_4_ == 0) || (uv._4_4_ == 1)) {
                        uVar1 = ref_dict_location(ref_dict_jump,(&item)[nnode_sens0],&nnode);
                        if (uVar1 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                 ,0xd47,"ref_geom_face_tec_zone",(ulong)uVar1,"localize");
                          return uVar1;
                        }
                      }
                      else {
                        uVar1 = ref_dict_location(ref_dict_degen,(&item)[nnode_sens0],&nnode);
                        if (uVar1 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                 ,0xd4a,"ref_geom_face_tec_zone",(ulong)uVar1,"localize");
                          return uVar1;
                        }
                        nnode = ntri + nnode;
                      }
                    }
                    else {
                      uVar1 = ref_dict_location(_cell,local_60,&nnode);
                      if (uVar1 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                               ,0xd4e,"ref_geom_face_tec_zone",(ulong)uVar1,"localize");
                        return uVar1;
                      }
                      nnode = sens + nnode;
                    }
                    fprintf((FILE *)ref_node," %d",(ulong)(nnode + 1));
                  }
                  fprintf((FILE *)ref_node,"\n");
                }
              }
              uVar1 = ref_dict_free(_cell);
              if (uVar1 == 0) {
                uVar1 = ref_dict_free(ref_dict_degen);
                if (uVar1 == 0) {
                  ref_grid_local._4_4_ = ref_dict_free(ref_dict_jump);
                  if (ref_grid_local._4_4_ == 0) {
                    ref_grid_local._4_4_ = 0;
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                           ,0xd59,"ref_geom_face_tec_zone",(ulong)ref_grid_local._4_4_,"free dict");
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                         ,0xd58,"ref_geom_face_tec_zone",(ulong)uVar1,"free jump");
                  ref_grid_local._4_4_ = uVar1;
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0xd57,"ref_geom_face_tec_zone",(ulong)uVar1,"free degen");
                ref_grid_local._4_4_ = uVar1;
              }
            }
          }
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0xcab,"ref_geom_face_tec_zone",(ulong)uVar1,"create dict");
        ref_grid_local._4_4_ = uVar1;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xcaa,
             "ref_geom_face_tec_zone",(ulong)uVar1,"create dict");
      ref_grid_local._4_4_ = uVar1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xca9,
           "ref_geom_face_tec_zone",(ulong)uVar1,"create dict");
    ref_grid_local._4_4_ = uVar1;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_geom_face_tec_zone(REF_GRID ref_grid, REF_INT id,
                                          FILE *file) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_DICT ref_dict, ref_dict_jump, ref_dict_degen;
  REF_INT geom, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT item2, item, local, node;
  REF_INT nnode, nnode_sens0, nnode_degen, ntri;
  REF_INT sens;
  REF_DBL *uv, param[2];
  REF_DBL kr, r[3], ks, s[3], xyz[3], kmin, kmax, gap;

  RSS(ref_dict_create(&ref_dict), "create dict");
  RSS(ref_dict_create(&ref_dict_jump), "create dict");
  RSS(ref_dict_create(&ref_dict_degen), "create dict");

  each_ref_geom_face(ref_geom, geom) {
    node = ref_geom_node(ref_geom, geom);
    if (id == ref_geom_id(ref_geom, geom)) {
      if (0 == ref_geom_degen(ref_geom, geom)) {
        RSS(ref_dict_store(ref_dict, node, geom), "mark nodes");
        if (0 != ref_geom_jump(ref_geom, geom)) {
          RSS(ref_dict_store(ref_dict_jump, node, geom), "mark jump");
        }
      } else {
        each_ref_cell_having_node(ref_cell, node, item, cell) {
          RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
          if (id == nodes[3]) {
            RSS(ref_dict_store(ref_dict_degen, cell, node), "mark degen");
          }
        }
      }
    }
  }

  nnode_sens0 = ref_dict_n(ref_dict);
  nnode_degen = ref_dict_n(ref_dict) + ref_dict_n(ref_dict_jump);
  nnode = ref_dict_n(ref_dict) + ref_dict_n(ref_dict_jump) +
          ref_dict_n(ref_dict_degen);

  ntri = 0;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (id == nodes[3]) {
      ntri++;
    }
  }

  /* skip degenerate */
  if (0 == nnode || 0 == ntri) {
    RSS(ref_dict_free(ref_dict_degen), "free degen");
    RSS(ref_dict_free(ref_dict_jump), "free jump");
    RSS(ref_dict_free(ref_dict), "free dict");
    return REF_SUCCESS;
  }

  fprintf(
      file,
      "zone t=\"face%d\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
      id, nnode, ntri, "point", "fetriangle");

  ref_malloc_init(uv, 2 * nnode, REF_DBL, -1.0);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (id == nodes[3]) {
      each_ref_cell_cell_node(ref_cell, node) {
        RSS(ref_geom_find(ref_geom, nodes[node], REF_GEOM_FACE, id, &geom),
            "find");
        RSS(ref_geom_cell_tuv(ref_geom, nodes[node], nodes, REF_GEOM_FACE,
                              param, &sens),
            "cell tuv");
        if (0 == ref_geom_degen(ref_geom, geom)) {
          if (0 == sens || 1 == sens) {
            RSS(ref_dict_location(ref_dict, nodes[node], &local), "localize");
          } else {
            RSS(ref_dict_location(ref_dict_jump, nodes[node], &local),
                "localize");
            local += nnode_sens0;
          }
        } else {
          RSS(ref_dict_location(ref_dict_degen, cell, &local), "localize");
          local += nnode_degen;
        }
        uv[0 + 2 * local] = param[0];
        uv[1 + 2 * local] = param[1];
      }
    }
  }

  each_ref_dict_key_value(ref_dict, item, node, geom) {
    kr = 0;
    ks = 0;
    gap = 0;
    xyz[0] = ref_node_xyz(ref_node, 0, node);
    xyz[1] = ref_node_xyz(ref_node, 1, node);
    xyz[2] = ref_node_xyz(ref_node, 2, node);
    if (ref_geom_model_loaded(ref_geom)) {
      RXS(ref_egads_face_curvature(ref_geom, geom, &kr, r, &ks, s), REF_FAILURE,
          "curve");
      RSS(ref_egads_eval_at(ref_geom, REF_GEOM_FACE, id, &(uv[2 * item]), xyz,
                            NULL),
          "eval at");
      RSS(ref_egads_gap(ref_geom, node, &gap), "gap")
    }
    if (ref_geom_meshlinked(ref_geom)) {
      RSS(ref_meshlink_face_curvature(ref_grid, geom, &kr, r, &ks, s), "curve");
    }
    kmax = MAX(ABS(kr), ABS(ks));
    kmin = MIN(ABS(kr), ABS(ks));
    fprintf(file, " %.16e %.16e %.16e %.16e %.16e %.16e %.16e %16e\n", xyz[0],
            xyz[1], xyz[2], gap, uv[0 + 2 * item], uv[1 + 2 * item], kmax,
            kmin);
  }
  each_ref_dict_key_value(ref_dict_jump, item, node, geom) {
    kr = 0;
    ks = 0;
    gap = 0;
    xyz[0] = ref_node_xyz(ref_node, 0, node);
    xyz[1] = ref_node_xyz(ref_node, 1, node);
    xyz[2] = ref_node_xyz(ref_node, 2, node);
    if (ref_geom_model_loaded(ref_geom)) {
      RXS(ref_egads_face_curvature(ref_geom, geom, &kr, r, &ks, s), REF_FAILURE,
          "curve");
      RSS(ref_egads_eval_at(ref_geom, REF_GEOM_FACE, id,
                            &(uv[2 * (nnode_sens0 + item)]), xyz, NULL),
          "eval at");
      RSS(ref_egads_gap(ref_geom, node, &gap), "gap")
    }
    kmax = MAX(ABS(kr), ABS(ks));
    kmin = MAX(ABS(kr), ABS(ks));
    fprintf(file, " %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e\n", xyz[0],
            xyz[1], xyz[2], gap, uv[0 + 2 * (nnode_sens0 + item)],
            uv[1 + 2 * (nnode_sens0 + item)], kmax, kmin);
  }
  each_ref_dict_key_value(ref_dict_degen, item, cell, node) {
    kr = 0;
    ks = 0;
    gap = 0;
    xyz[0] = ref_node_xyz(ref_node, 0, node);
    xyz[1] = ref_node_xyz(ref_node, 1, node);
    xyz[2] = ref_node_xyz(ref_node, 2, node);
    if (ref_geom_model_loaded(ref_geom)) {
      each_ref_geom_having_node(ref_geom, node, item2, geom) {
        if (ref_geom_type(ref_geom, geom) == REF_GEOM_FACE &&
            ref_geom_id(ref_geom, geom) == id) {
          RXS(ref_egads_face_curvature(ref_geom, geom, &kr, r, &ks, s),
              REF_FAILURE, "curve");
        }
      }
      RSS(ref_egads_eval_at(ref_geom, REF_GEOM_FACE, id,
                            &(uv[2 * (nnode_degen + item)]), xyz, NULL),
          "eval at");
      RSS(ref_egads_gap(ref_geom, node, &gap), "gap")
    }
    kmax = MAX(ABS(kr), ABS(ks));
    kmin = MAX(ABS(kr), ABS(ks));
    fprintf(file, " %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e\n", xyz[0],
            xyz[1], xyz[2], gap, uv[0 + 2 * (nnode_degen + item)],
            uv[1 + 2 * (nnode_degen + item)], kmax, kmin);
  }
  ref_free(uv);

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (id == nodes[3]) {
      each_ref_cell_cell_node(ref_cell, node) {
        RSS(ref_geom_find(ref_geom, nodes[node], REF_GEOM_FACE, id, &geom),
            "find");
        RSS(ref_geom_cell_tuv(ref_geom, nodes[node], nodes, REF_GEOM_FACE,
                              param, &sens),
            "cell tuv");
        if (0 == ref_geom_degen(ref_geom, geom)) {
          if (0 == sens || 1 == sens) {
            RSS(ref_dict_location(ref_dict, nodes[node], &local), "localize");
          } else {
            RSS(ref_dict_location(ref_dict_jump, nodes[node], &local),
                "localize");
            local += nnode_sens0;
          }
        } else {
          RSS(ref_dict_location(ref_dict_degen, cell, &local), "localize");
          local += nnode_degen;
        }
        fprintf(file, " %d", local + 1);
      }
      fprintf(file, "\n");
    }
  }

  RSS(ref_dict_free(ref_dict_degen), "free degen");
  RSS(ref_dict_free(ref_dict_jump), "free jump");
  RSS(ref_dict_free(ref_dict), "free dict");

  return REF_SUCCESS;
}